

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::shapeSimpleRecurrentLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  size_t val;
  LogMessage *pLVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  mapped_type *this_02;
  mapped_type *this_03;
  LayerUnion LVar2;
  ShapeRange *other;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_04;
  LogFinisher local_69;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  this_04 = &this->blobShapes;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_04,(key_type *)
                                 ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0])
  ;
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_04,(key_type *)
                                 ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]
                        );
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  this_02 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_04,*(key_type **)
                                  ((specLayer->input_).super_RepeatedPtrFieldBase.rep_ + 1));
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  this_03 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_04,*(key_type **)
                                  ((specLayer->output_).super_RepeatedPtrFieldBase.rep_ + 1));
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  ShapeConstraint::setName
            (this_03,*(string **)((specLayer->output_).super_RepeatedPtrFieldBase.rep_ + 1));
  if (specLayer->_oneof_case_[0] == 400) {
    LVar2 = specLayer->layer_;
  }
  else {
    LVar2.simplerecurrent_ = Specification::SimpleRecurrentLayerParams::default_instance();
  }
  val = (LVar2.simplerecurrent_)->outputvectorsize_;
  ShapeConstraint::setChannel(this_00,(LVar2.batchnorm_)->channels_);
  ShapeConstraint::setHeight(this_00,1);
  ShapeConstraint::setWidth(this_00,1);
  ShapeConstraint::setChannel(this_01,val);
  ShapeConstraint::setHeight(this_01,1);
  ShapeConstraint::setWidth(this_01,1);
  if ((LVar2.pooling_)->avgpoolexcludepadding_ == true) {
    other = ShapeConstraint::sequenceRange(this_00);
    ShapeConstraint::updateSequenceRange(this_01,other);
  }
  else {
    ShapeConstraint::setSequence(this_01,1);
  }
  ShapeConstraint::setSequence(this_02,1);
  ShapeConstraint::setChannel(this_02,val);
  ShapeConstraint::setHeight(this_02,1);
  ShapeConstraint::setWidth(this_02,1);
  ShapeConstraint::setSequence(this_03,1);
  ShapeConstraint::setChannel(this_03,val);
  ShapeConstraint::setHeight(this_03,1);
  ShapeConstraint::setWidth(this_03,1);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeSimpleRecurrentLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

    ShapeConstraint& stateInShape = blobShapes[specLayer.input(1)];
    ShapeConstraint& stateOutShape = blobShapes[specLayer.output(1)];
    stateOutShape.setName(specLayer.output(1));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Simple Recurrent layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Simple Recurrent layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

    const Specification::SimpleRecurrentLayerParams& recurrent = specLayer.simplerecurrent();

    size_t inSize = (size_t)recurrent.inputvectorsize();
    size_t outSize = (size_t)recurrent.outputvectorsize();

    inputShape.setChannel(inSize);
    inputShape.setHeight(1);
    inputShape.setWidth(1);

    outputShape.setChannel(outSize);
    outputShape.setHeight(1);
    outputShape.setWidth(1);

    if (recurrent.sequenceoutput()) {
        outputShape.updateSequenceRange(inputShape.sequenceRange());
    }
    else {
        outputShape.setSequence(1);
    }

    stateInShape.setSequence(1);
    stateInShape.setChannel(outSize);
    stateInShape.setHeight(1);
    stateInShape.setWidth(1);

    stateOutShape.setSequence(1);
    stateOutShape.setChannel(outSize);
    stateOutShape.setHeight(1);
    stateOutShape.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Simple Recurrent layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Simple Recurrent layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

}